

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAbstractAnimation::setCurrentTime(QAbstractAnimation *this,int msecs)

{
  parameter_type pVar1;
  parameter_type pVar2;
  parameter_type pVar3;
  parameter_type pVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  QAbstractAnimationPrivate *pQVar7;
  int *piVar8;
  long *in_RDI;
  long in_FS_OFFSET;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  *unaff_retaddr;
  int newTotalCurrentTime;
  int newCurrentLoop;
  int oldLoop;
  Direction currentDirection;
  int oldCurrentTime;
  int totalLoopCount;
  QAbstractAnimationPrivate *d;
  int totalDura;
  int dura;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_68;
  int local_64;
  int in_stack_ffffffffffffffa0;
  int iVar9;
  int local_4c;
  int local_24 [4];
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QAbstractAnimation *)0x669bce);
  local_14[1] = 0;
  piVar8 = qMax<int>(local_14 + 2,local_14 + 1);
  local_14[2] = *piVar8;
  local_14[0] = (**(code **)(*in_RDI + 0x60))();
  pVar1 = QObjectBindableProperty::operator_cast_to_int
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                      *)0x669c10);
  iVar9 = local_14[0];
  if (0 < local_14[0]) {
    if (pVar1 < 0) {
      in_stack_ffffffffffffffa0 = -1;
      iVar9 = in_stack_ffffffffffffffa0;
    }
    else {
      in_stack_ffffffffffffffa0 = local_14[0] * pVar1;
      iVar9 = in_stack_ffffffffffffffa0;
    }
  }
  local_24[3] = iVar9;
  if (iVar9 != -1) {
    piVar8 = qMin<int>(local_24 + 3,local_14 + 2);
    local_14[2] = *piVar8;
  }
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              *)CONCAT44(iVar9,in_stack_ffffffffffffffa0));
  pVar2 = QPropertyData<int>::valueBypassingBindings
                    (&(pQVar7->totalCurrentTime).super_QPropertyData<int>);
  QPropertyData<int>::setValueBypassingBindings
            (&(pQVar7->totalCurrentTime).super_QPropertyData<int>,local_14[2]);
  pVar3 = ::QObjectCompatProperty::operator_cast_to_Direction
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                      *)0x669cb9);
  pVar4 = QPropertyData<int>::valueBypassingBindings
                    (&(pQVar7->currentLoop).super_QPropertyData<int>);
  if (local_14[0] < 1) {
    local_64 = 0;
  }
  else {
    local_64 = local_14[2] / local_14[0];
  }
  local_4c = local_64;
  if (local_64 == pVar1) {
    local_24[2] = 0;
    piVar8 = qMax<int>(local_24 + 2,local_14);
    pQVar7->currentTime = *piVar8;
    local_24[1] = 0;
    local_24[0] = pVar1 + -1;
    piVar8 = qMax<int>(local_24 + 1,local_24);
    local_4c = *piVar8;
  }
  else if (pVar3 == Forward) {
    if (local_14[0] < 1) {
      local_68 = local_14[2];
    }
    else {
      local_68 = local_14[2] % local_14[0];
    }
    pQVar7->currentTime = local_68;
  }
  else {
    in_stack_ffffffffffffff94 = local_14[2];
    if (0 < local_14[0]) {
      in_stack_ffffffffffffff94 = (local_14[2] + -1) % local_14[0] + 1;
    }
    pQVar7->currentTime = in_stack_ffffffffffffff94;
    if (pQVar7->currentTime == local_14[0]) {
      local_4c = local_64 + -1;
    }
  }
  QPropertyData<int>::setValueBypassingBindings
            (&(pQVar7->currentLoop).super_QPropertyData<int>,local_4c);
  (**(code **)(*in_RDI + 0x68))(in_RDI,pQVar7->currentTime);
  pVar5 = QPropertyData<int>::valueBypassingBindings
                    (&(pQVar7->currentLoop).super_QPropertyData<int>);
  pVar3 = ::QObjectCompatProperty::operator_cast_to_Direction
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                      *)0x669e2a);
  pVar6 = QPropertyData<int>::valueBypassingBindings
                    (&(pQVar7->totalCurrentTime).super_QPropertyData<int>);
  if (pVar5 != pVar4) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
    ::notify((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              *)unaff_retaddr);
  }
  if (pVar2 != pVar6) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::notify(unaff_retaddr);
  }
  if (((pVar3 == Forward) && (pVar6 == local_24[3])) || ((pVar3 == Backward && (pVar6 == 0)))) {
    stop((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractAnimation::setCurrentTime(int msecs)
{
    Q_D(QAbstractAnimation);
    msecs = qMax(msecs, 0);

    // Calculate new time and loop.
    const int dura = duration();
    const int totalLoopCount = d->loopCount;
    const int totalDura = dura <= 0 ? dura : ((totalLoopCount < 0) ? -1 : dura * totalLoopCount);
    if (totalDura != -1)
        msecs = qMin(totalDura, msecs);

    d->totalCurrentTime.removeBindingUnlessInWrapper();

    const int oldCurrentTime = d->totalCurrentTime.valueBypassingBindings();
    d->totalCurrentTime.setValueBypassingBindings(msecs);

    QAbstractAnimation::Direction currentDirection = d->direction;

    // Update new values.
    const int oldLoop = d->currentLoop.valueBypassingBindings();
    int newCurrentLoop = (dura <= 0) ? 0 : (msecs / dura);
    if (newCurrentLoop == totalLoopCount) {
        //we're at the end
        d->currentTime = qMax(0, dura);
        newCurrentLoop = qMax(0, totalLoopCount - 1);
    } else {
        if (currentDirection == Forward) {
            d->currentTime = (dura <= 0) ? msecs : (msecs % dura);
        } else {
            d->currentTime = (dura <= 0) ? msecs : ((msecs - 1) % dura) + 1;
            if (d->currentTime == dura)
                newCurrentLoop = newCurrentLoop - 1;
        }
    }
    d->currentLoop.setValueBypassingBindings(newCurrentLoop);

    // this is a virtual function, so it can update the properties as well
    updateCurrentTime(d->currentTime);

    // read the property values again
    newCurrentLoop = d->currentLoop.valueBypassingBindings();
    currentDirection = d->direction;
    const int newTotalCurrentTime = d->totalCurrentTime.valueBypassingBindings();

    if (newCurrentLoop != oldLoop)
        d->currentLoop.notify();

    /* Notify before calling stop: As seen in tst_QSequentialAnimationGroup::clear
     * we might delete the animation when stop is called. Thus after stop no member
     * of the object must be used anymore.
     */
    if (oldCurrentTime != newTotalCurrentTime)
        d->totalCurrentTime.notify();
    // All animations are responsible for stopping the animation when their
    // own end state is reached; in this case the animation is time driven,
    // and has reached the end.
    if ((currentDirection == Forward && newTotalCurrentTime == totalDura)
        || (currentDirection == Backward && newTotalCurrentTime == 0)) {
        stop();
    }
}